

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_obj.c
# Opt level: O0

int lj_obj_equal(cTValue *o1,cTValue *o2)

{
  cTValue *o2_local;
  cTValue *o1_local;
  
  if ((int)(o1->field_4).it >> 0xf == (int)(o2->field_4).it >> 0xf) {
    if (0xfffffffc < (uint)((int)(o1->field_4).it >> 0xf)) {
      return 1;
    }
    if (0xfffffff1 < (uint)((int)(o1->field_4).it >> 0xf)) {
      return (uint)(o1->u64 == o2->u64);
    }
  }
  else if ((0xfffffff2 < (uint)((int)(o1->field_4).it >> 0xf)) ||
          (0xfffffff2 < (uint)((int)(o2->field_4).it >> 0xf))) {
    return 0;
  }
  return (uint)(o1->n == o2->n);
}

Assistant:

int LJ_FASTCALL lj_obj_equal(cTValue *o1, cTValue *o2)
{
  if (itype(o1) == itype(o2)) {
    if (tvispri(o1))
      return 1;
    if (!tvisnum(o1))
      return gcrefeq(o1->gcr, o2->gcr);
  } else if (!tvisnumber(o1) || !tvisnumber(o2)) {
    return 0;
  }
  return numberVnum(o1) == numberVnum(o2);
}